

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetParametersTest::TestDefaultFramebuffer
          (GetParametersTest *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  undefined4 uVar1;
  char *pcVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  size_t sVar5;
  bool bVar6;
  GLchar **ppGVar7;
  long lVar8;
  GLint parameter_dsa;
  GLint parameter_legacy;
  int local_1d0;
  int local_1cc;
  GetParametersTest *local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  local_1c8 = this;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  this_00 = (ostringstream *)(local_1b0 + 8);
  bVar6 = true;
  ppGVar7 = TestDefaultFramebuffer::pnames_strings;
  lVar8 = 0;
  do {
    local_1cc = 0;
    local_1d0 = 0;
    uVar1 = *(undefined4 *)((long)TestDefaultFramebuffer::pnames + lVar8);
    (**(code **)(lVar4 + 0x838))(0x8d40,uVar1,&local_1cc);
    err = (**(code **)(lVar4 + 0x800))();
    glu::checkError(err,"glGetFramebufferParameteriv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xed9);
    (**(code **)(lVar4 + 0x918))(0,uVar1,&local_1d0);
    iVar3 = (**(code **)(lVar4 + 0x800))();
    if (iVar3 == 0) {
      if (local_1cc != local_1d0) {
        local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
        this_01 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"GetNamedFramebufferParameteriv returned ",0x28);
        std::ostream::operator<<(this_01,local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", but ",6);
        std::ostream::operator<<(this_01,local_1cc);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01," was expected for ",0x12);
        pcVar2 = *ppGVar7;
        sVar5 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar2,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01," parameter name of default object.",0x22);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00a93276;
      }
    }
    else {
      local_1b0._0_8_ = ((local_1c8->super_TestCase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"GetNamedFramebufferParameteriv unexpectedly generated ",0x36);
      local_1c0.m_getName = glu::getErrorName;
      local_1c0.m_value = iVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," error when called with ",0x18);
      pcVar2 = *ppGVar7;
      sVar5 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar2,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," parameter name for default framebuffer.",0x28);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00a93276:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      std::ios_base::~ios_base(local_138);
      bVar6 = false;
    }
    lVar8 = lVar8 + 4;
    ppGVar7 = ppGVar7 + 1;
    if (lVar8 == 0x18) {
      return bVar6;
    }
  } while( true );
}

Assistant:

bool GetParametersTest::TestDefaultFramebuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result. */
	bool is_ok = true;

	static const glw::GLenum pnames[] = { GL_DOUBLEBUFFER,
										  GL_IMPLEMENTATION_COLOR_READ_FORMAT,
										  GL_IMPLEMENTATION_COLOR_READ_TYPE,
										  GL_SAMPLES,
										  GL_SAMPLE_BUFFERS,
										  GL_STEREO };

	static const glw::GLchar* pnames_strings[] = { "GL_DOUBLEBUFFER",
												   "GL_IMPLEMENTATION_COLOR_READ_FORMAT",
												   "GL_IMPLEMENTATION_COLOR_READ_TYPE",
												   "GL_SAMPLES",
												   "GL_SAMPLE_BUFFERS",
												   "GL_STEREO" };

	glw::GLuint pnames_count = sizeof(pnames) / sizeof(pnames[0]);

	for (glw::GLuint i = 0; i < pnames_count; ++i)
	{
		glw::GLint parameter_legacy = 0;
		glw::GLint parameter_dsa	= 0;

		gl.getFramebufferParameteriv(GL_FRAMEBUFFER, pnames[i], &parameter_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFramebufferParameteriv has failed");

		gl.getNamedFramebufferParameteriv(0, pnames[i], &parameter_dsa);

		if (glw::GLenum error = gl.getError())
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "GetNamedFramebufferParameteriv unexpectedly generated "
				<< glu::getErrorStr(error) << " error when called with " << pnames_strings[i]
				<< " parameter name for default framebuffer." << tcu::TestLog::EndMessage;

			is_ok = false;

			continue;
		}

		if (parameter_legacy != parameter_dsa)
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedFramebufferParameteriv returned "
												<< parameter_dsa << ", but " << parameter_legacy << " was expected for "
												<< pnames_strings[i] << " parameter name of default object."
												<< tcu::TestLog::EndMessage;

			is_ok = false;
		}
	}

	return is_ok;
}